

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O1

UStringTrieResult __thiscall icu_63::UCharsTrie::current(UCharsTrie *this)

{
  char16_t cVar1;
  
  if (this->pos_ == (char16_t *)0x0) {
    return USTRINGTRIE_NO_MATCH;
  }
  if ((this->remainingMatchLength_ < 0) && (cVar1 = *this->pos_, 0x3f < (ushort)cVar1)) {
    return (ushort)cVar1 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
  }
  return USTRINGTRIE_NO_VALUE;
}

Assistant:

UStringTrieResult
UCharsTrie::current() const {
    const UChar *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    } else {
        int32_t node;
        return (remainingMatchLength_<0 && (node=*pos)>=kMinValueLead) ?
                valueResult(node) : USTRINGTRIE_NO_VALUE;
    }
}